

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int recv_with_timeout(amqp_connection_state_t state,uint64_t start,timeval *timeout)

{
  int iVar1;
  int iVar2;
  pollfd in_RAX;
  int *piVar3;
  uint64_t uVar4;
  ssize_t sVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  pollfd pfd;
  
  pfd = in_RAX;
  if (timeout != (timeval *)0x0) {
    iVar1 = amqp_get_sockfd(state);
    if (iVar1 == -1) {
      return -7;
    }
    uVar6 = timeout->tv_sec;
    uVar7 = timeout->tv_usec;
    if (0x7fffffff < uVar7 / 1000 + uVar6 * 1000) {
      return -10;
    }
    while( true ) {
      pfd.events = 1;
      pfd.revents = 0;
      pfd.fd = iVar1;
      iVar2 = poll((pollfd *)&pfd,1,(int)uVar6 * 1000 + (int)((long)uVar7 / 1000));
      if (0 < iVar2) break;
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
          return -9;
        }
        uVar4 = amqp_get_monotonic_timestamp();
        if (uVar4 == 0) {
          return -0xe;
        }
        uVar6 = timeout->tv_usec * 1000 + timeout->tv_sec * 1000000000 + start;
        uVar7 = uVar6 - uVar4;
        if (uVar6 < uVar4) {
          return -0xd;
        }
        uVar6 = uVar7 / 1000000000;
        timeout->tv_sec = uVar6;
        uVar7 = (uVar7 % 1000000000) / 1000;
        timeout->tv_usec = uVar7;
      }
      else {
        if (iVar2 == 0) {
          return -0xd;
        }
        uVar6 = timeout->tv_sec;
        uVar7 = timeout->tv_usec;
      }
    }
  }
  sVar5 = (*state->socket->klass->recv)
                    (state->socket,(state->sock_inbound_buffer).bytes,
                     (state->sock_inbound_buffer).len,0);
  uVar8 = (uint)sVar5;
  if (-1 < (int)uVar8) {
    state->sock_inbound_limit = (ulong)(uVar8 & 0x7fffffff);
    state->sock_inbound_offset = 0;
    if (0 < state->heartbeat) {
      uVar4 = amqp_get_monotonic_timestamp();
      if (uVar4 == 0) {
        return -0xe;
      }
      state->next_recv_heartbeat = (long)state->heartbeat * 2000000000 + uVar4;
    }
    uVar8 = 0;
  }
  return uVar8;
}

Assistant:

static int recv_with_timeout(amqp_connection_state_t state, uint64_t start, struct timeval *timeout)
{
  int res;

  if (timeout) {
    int fd;

    fd = amqp_get_sockfd(state);
    if (-1 == fd) {
      return AMQP_STATUS_CONNECTION_CLOSED;
    }

    if (INT_MAX < (uint64_t)timeout->tv_sec * AMQP_MS_PER_S +
        (uint64_t)timeout->tv_usec / AMQP_US_PER_MS) {
      return AMQP_STATUS_INVALID_PARAMETER;
    }

    while (1) {
      struct pollfd pfd;
      int timeout_ms;

      pfd.fd = fd;
      pfd.events = POLLIN;
      pfd.revents = 0;

      timeout_ms = timeout->tv_sec * AMQP_MS_PER_S +
          timeout->tv_usec / AMQP_US_PER_MS;

      res = poll(&pfd, 1, timeout_ms);

      if (0 < res) {
        break;
      } else if (0 == res) {
        return AMQP_STATUS_TIMEOUT;
      } else if (-1 == res) {
        if (EINTR == errno) {
          if (timeout) {
            uint64_t end_timestamp;
            uint64_t time_left;
            uint64_t current_timestamp = amqp_get_monotonic_timestamp();
            if (0 == current_timestamp) {
              return AMQP_STATUS_TIMER_FAILURE;
            }
            end_timestamp = start +
              (uint64_t)timeout->tv_sec * AMQP_NS_PER_S +
              (uint64_t)timeout->tv_usec * AMQP_NS_PER_US;
            if (current_timestamp > end_timestamp) {
              return AMQP_STATUS_TIMEOUT;
            }

            time_left = end_timestamp - current_timestamp;

            timeout->tv_sec = time_left / AMQP_NS_PER_S;
            timeout->tv_usec = (time_left % AMQP_NS_PER_S) / AMQP_NS_PER_US;
          }
          continue;
        }
        return AMQP_STATUS_SOCKET_ERROR;
      }
    }
  }

  res = amqp_socket_recv(state->socket, state->sock_inbound_buffer.bytes,
                         state->sock_inbound_buffer.len, 0);

  if (res < 0) {
    return res;
  }

  state->sock_inbound_limit = res;
  state->sock_inbound_offset = 0;

  if (amqp_heartbeat_enabled(state)) {
    uint64_t current_time = amqp_get_monotonic_timestamp();
    if (0 == current_time) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
    state->next_recv_heartbeat = amqp_calc_next_recv_heartbeat(state, current_time);
  }

  return AMQP_STATUS_OK;
}